

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_utxoutil.cpp
# Opt level: O0

void __thiscall
UtxoUtil_ConvertToUtxo_list_Test::~UtxoUtil_ConvertToUtxo_list_Test
          (UtxoUtil_ConvertToUtxo_list_Test *this)

{
  void *in_RDI;
  
  ~UtxoUtil_ConvertToUtxo_list_Test((UtxoUtil_ConvertToUtxo_list_Test *)0x245c38);
  operator_delete(in_RDI);
  return;
}

Assistant:

TEST(UtxoUtil, ConvertToUtxo_list)
{
  std::vector<UtxoData> utxos;
  UtxoData utxo1;
  utxo1.txid = Txid("9e1ead91c432889cb478237da974dd1e9009c9e22694fd1e3999c40a1ef59b0a");
  utxo1.vout = 1;
  utxo1.address_type = AddressType::kP2wpkhAddress;
  UtxoData utxo2;
  utxo2.txid = Txid("8f4af7ee42e62a3d32f25ca56f618fb2f5df3d4c3a9c59e2c3646c5535a3d40a");
  utxo2.vout = 2;
  utxo2.address_type = AddressType::kP2wpkhAddress;
  utxos.push_back(utxo1);
  utxos.push_back(utxo2);

  std::vector<Utxo> results;
  EXPECT_NO_THROW((results = UtxoUtil::ConvertToUtxo(utxos)));
  EXPECT_EQ(results.size(), 2);
  if (results.size() == 2) {
    EXPECT_TRUE((memcmp(results[0].txid,
        utxo1.txid.GetData().GetBytes().data(), sizeof(results[0].txid)) == 0));
    EXPECT_EQ(results[0].vout, utxo1.vout);
    EXPECT_TRUE((memcmp(results[1].txid,
        utxo2.txid.GetData().GetBytes().data(), sizeof(results[1].txid)) == 0));
    EXPECT_EQ(results[1].vout, utxo2.vout);
  }
}